

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

errr finish_parse_eff(parser *p)

{
  ushort uVar1;
  blow_effect *pbVar2;
  uint uVar3;
  uint local_24;
  wchar_t count;
  blow_effect *next;
  blow_effect *eff;
  parser *p_local;
  
  z_info->blow_effects_max = 0;
  for (next = (blow_effect *)parser_priv(p); next != (blow_effect *)0x0; next = next->next) {
    z_info->blow_effects_max = z_info->blow_effects_max + 1;
  }
  uVar1 = z_info->blow_effects_max;
  blow_effects = (blow_effect *)mem_zalloc((long)(int)(z_info->blow_effects_max + 1) * 0x38);
  next = (blow_effect *)parser_priv(p);
  uVar3 = (uint)uVar1;
  while (local_24 = uVar3 - 1, next != (blow_effect *)0x0) {
    memcpy(blow_effects + (int)local_24,next,0x38);
    pbVar2 = next->next;
    if ((int)local_24 < (int)(z_info->blow_effects_max - 1)) {
      blow_effects[(int)local_24].next = blow_effects + (int)uVar3;
    }
    else {
      blow_effects[(int)local_24].next = (blow_effect *)0x0;
    }
    mem_free(next);
    next = pbVar2;
    uVar3 = local_24;
  }
  z_info->blow_effects_max = z_info->blow_effects_max + 1;
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_eff(struct parser *p) {
	struct blow_effect *eff, *next = NULL;
	int count;

	/* Count the entries */
	z_info->blow_effects_max = 0;
	eff = parser_priv(p);
	while (eff) {
		z_info->blow_effects_max++;
		eff = eff->next;
	}

	/* Allocate the direct access list and copy the data to it */
	count = z_info->blow_effects_max - 1;
	blow_effects = mem_zalloc((z_info->blow_effects_max + 1) * sizeof(*eff));
	for (eff = parser_priv(p); eff; eff = next, count--) {
		memcpy(&blow_effects[count], eff, sizeof(*eff));
		next = eff->next;
		if (count < z_info->blow_effects_max - 1)
			blow_effects[count].next = &blow_effects[count + 1];
		else
			blow_effects[count].next = NULL;

		mem_free(eff);
	}
	z_info->blow_effects_max++;

	parser_destroy(p);
	return 0;
}